

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

void helper_ljmp_protected_x86_64
               (CPUX86State *env,int new_cs,target_ulong new_eip,target_ulong next_eip)

{
  CPUX86State *pCVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  uintptr_t unaff_retaddr;
  uint32_t limit;
  uint32_t rpl;
  uint32_t dpl;
  uint32_t cpl;
  uint32_t e2;
  uint32_t e1;
  int type;
  int gate_cs;
  target_ulong next_eip_local;
  target_ulong new_eip_local;
  CPUX86State *pCStack_10;
  int new_cs_local;
  CPUX86State *env_local;
  
  _type = next_eip;
  next_eip_local = new_eip;
  new_eip_local._4_4_ = new_cs;
  pCStack_10 = env;
  if ((new_cs & 0xfffcU) == 0) {
    raise_exception_err_ra_x86_64(env,0xd,0,unaff_retaddr);
  }
  iVar2 = load_segment_ra(env,&cpl,&dpl,new_cs,unaff_retaddr);
  if (iVar2 != 0) {
    raise_exception_err_ra_x86_64(pCStack_10,0xd,new_eip_local._4_4_ & 0xfffc,unaff_retaddr);
  }
  uVar3 = pCStack_10->hflags & 3;
  if ((dpl & 0x1000) != 0) {
    if ((dpl & 0x800) == 0) {
      raise_exception_err_ra_x86_64(pCStack_10,0xd,new_eip_local._4_4_ & 0xfffc,unaff_retaddr);
    }
    uVar4 = dpl >> 0xd & 3;
    if ((dpl & 0x400) == 0) {
      if (uVar3 < (new_eip_local._4_4_ & 3)) {
        raise_exception_err_ra_x86_64(pCStack_10,0xd,new_eip_local._4_4_ & 0xfffc,unaff_retaddr);
      }
      if (uVar4 != uVar3) {
        raise_exception_err_ra_x86_64(pCStack_10,0xd,new_eip_local._4_4_ & 0xfffc,unaff_retaddr);
      }
    }
    else if (uVar3 < uVar4) {
      raise_exception_err_ra_x86_64(pCStack_10,0xd,new_eip_local._4_4_ & 0xfffc,unaff_retaddr);
    }
    if ((dpl & 0x8000) == 0) {
      raise_exception_err_ra_x86_64(pCStack_10,0xb,new_eip_local._4_4_ & 0xfffc,unaff_retaddr);
    }
    uVar4 = get_seg_limit(cpl,dpl);
    pCVar1 = pCStack_10;
    if ((uVar4 < next_eip_local) &&
       (((pCStack_10->hflags & 0x4000) == 0 || ((dpl & 0x200000) == 0)))) {
      raise_exception_err_ra_x86_64(pCStack_10,0xd,0,unaff_retaddr);
    }
    uVar5 = new_eip_local._4_4_ & 0xfffc;
    uVar6 = get_seg_base(cpl,dpl);
    cpu_x86_load_seg_cache(pCVar1,1,uVar5 | uVar3,(ulong)uVar6,uVar4,dpl);
    pCStack_10->eip = next_eip_local;
    return;
  }
  uVar3 = dpl >> 0xd & 3;
  uVar4 = pCStack_10->hflags & 3;
  e2 = dpl >> 8 & 0xf;
  if (((pCStack_10->efer & 0x400) != 0) && (e2 != 0xc)) {
    raise_exception_err_ra_x86_64(pCStack_10,0xd,new_eip_local._4_4_ & 0xfffc,unaff_retaddr);
  }
  if (e2 == 1) {
LAB_00539474:
    if ((uVar3 < uVar4) || (uVar3 < (new_eip_local._4_4_ & 3))) {
      raise_exception_err_ra_x86_64(pCStack_10,0xd,new_eip_local._4_4_ & 0xfffc,unaff_retaddr);
    }
    switch_tss_ra(pCStack_10,new_eip_local._4_4_,cpl,dpl,0,(uint32_t)_type,unaff_retaddr);
  }
  else {
    if (e2 != 4) {
      if ((e2 == 5) || (e2 == 9)) goto LAB_00539474;
      if (e2 != 0xc) {
        raise_exception_err_ra_x86_64(pCStack_10,0xd,new_eip_local._4_4_ & 0xfffc,unaff_retaddr);
      }
    }
    if ((uVar3 < uVar4) || (uVar3 < (new_eip_local._4_4_ & 3))) {
      raise_exception_err_ra_x86_64(pCStack_10,0xd,new_eip_local._4_4_ & 0xfffc,unaff_retaddr);
    }
    if ((dpl & 0x8000) == 0) {
      raise_exception_err_ra_x86_64(pCStack_10,0xb,new_eip_local._4_4_ & 0xfffc,unaff_retaddr);
    }
    e1 = cpl >> 0x10;
    uVar3 = cpl & 0xffff;
    if (e2 == 0xc) {
      uVar3 = dpl & 0xffff0000 | uVar3;
    }
    next_eip_local = (target_ulong)uVar3;
    if ((pCStack_10->efer & 0x400) != 0) {
      iVar2 = load_segment_ra(pCStack_10,&cpl,&dpl,new_eip_local._4_4_ + 8,unaff_retaddr);
      if (iVar2 != 0) {
        raise_exception_err_ra_x86_64(pCStack_10,0xd,new_eip_local._4_4_ & 0xfffc,unaff_retaddr);
      }
      e2 = dpl >> 8 & 0x1f;
      if (e2 != 0) {
        raise_exception_err_ra_x86_64(pCStack_10,0xd,new_eip_local._4_4_ & 0xfffc,unaff_retaddr);
      }
      next_eip_local = (ulong)cpl << 0x20 | next_eip_local;
      e2 = 0;
    }
    iVar2 = load_segment_ra(pCStack_10,&cpl,&dpl,e1,unaff_retaddr);
    if (iVar2 != 0) {
      raise_exception_err_ra_x86_64(pCStack_10,0xd,e1 & 0xfffc,unaff_retaddr);
    }
    uVar3 = dpl >> 0xd & 3;
    if ((dpl & 0x1800) != 0x1800) {
      raise_exception_err_ra_x86_64(pCStack_10,0xd,e1 & 0xfffc,unaff_retaddr);
    }
    if ((((dpl & 0x400) != 0) && (uVar4 < uVar3)) || (((dpl & 0x400) == 0 && (uVar3 != uVar4)))) {
      raise_exception_err_ra_x86_64(pCStack_10,0xd,e1 & 0xfffc,unaff_retaddr);
    }
    if ((pCStack_10->efer & 0x400) != 0) {
      if ((dpl & 0x200000) == 0) {
        raise_exception_err_ra_x86_64(pCStack_10,0xd,e1 & 0xfffc,unaff_retaddr);
      }
      if ((dpl & 0x400000) != 0) {
        raise_exception_err_ra_x86_64(pCStack_10,0xd,e1 & 0xfffc,unaff_retaddr);
      }
    }
    if ((dpl & 0x8000) == 0) {
      raise_exception_err_ra_x86_64(pCStack_10,0xd,e1 & 0xfffc,unaff_retaddr);
    }
    uVar3 = get_seg_limit(cpl,dpl);
    pCVar1 = pCStack_10;
    if ((uVar3 < next_eip_local) &&
       (((pCStack_10->hflags & 0x4000) == 0 || ((dpl & 0x200000) == 0)))) {
      raise_exception_err_ra_x86_64(pCStack_10,0xd,0,unaff_retaddr);
    }
    uVar5 = e1 & 0xfffc;
    uVar6 = get_seg_base(cpl,dpl);
    cpu_x86_load_seg_cache(pCVar1,1,uVar5 | uVar4,(ulong)uVar6,uVar3,dpl);
    pCStack_10->eip = next_eip_local;
  }
  return;
}

Assistant:

void helper_ljmp_protected(CPUX86State *env, int new_cs, target_ulong new_eip,
                           target_ulong next_eip)
{
    int gate_cs, type;
    uint32_t e1, e2, cpl, dpl, rpl, limit;

    if ((new_cs & 0xfffc) == 0) {
        raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
    }
    if (load_segment_ra(env, &e1, &e2, new_cs, GETPC()) != 0) {
        raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
    }
    cpl = env->hflags & HF_CPL_MASK;
    if (e2 & DESC_S_MASK) {
        if (!(e2 & DESC_CS_MASK)) {
            raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
        }
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        if (e2 & DESC_C_MASK) {
            /* conforming code segment */
            if (dpl > cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
        } else {
            /* non conforming code segment */
            rpl = new_cs & 3;
            if (rpl > cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
            if (dpl != cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, new_cs & 0xfffc, GETPC());
        }
        limit = get_seg_limit(e1, e2);
        if (new_eip > limit &&
            (!(env->hflags & HF_LMA_MASK) || !(e2 & DESC_L_MASK))) {
            raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
        }
        cpu_x86_load_seg_cache(env, R_CS, (new_cs & 0xfffc) | cpl,
                       get_seg_base(e1, e2), limit, e2);
        env->eip = new_eip;
    } else {
        /* jump to call or task gate */
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        rpl = new_cs & 3;
        cpl = env->hflags & HF_CPL_MASK;
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;

#ifdef TARGET_X86_64
        if (env->efer & MSR_EFER_LMA) {
            if (type != 12) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
        }
#endif
        switch (type) {
        case 1: /* 286 TSS */
        case 9: /* 386 TSS */
        case 5: /* task gate */
            if (dpl < cpl || dpl < rpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
            switch_tss_ra(env, new_cs, e1, e2, SWITCH_TSS_JMP, next_eip, GETPC());
            break;
        case 4: /* 286 call gate */
        case 12: /* 386 call gate */
            if ((dpl < cpl) || (dpl < rpl)) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
            if (!(e2 & DESC_P_MASK)) {
                raise_exception_err_ra(env, EXCP0B_NOSEG, new_cs & 0xfffc, GETPC());
            }
            gate_cs = e1 >> 16;
            new_eip = (e1 & 0xffff);
            if (type == 12) {
                new_eip |= (e2 & 0xffff0000);
            }

#ifdef TARGET_X86_64
            if (env->efer & MSR_EFER_LMA) {
                /* load the upper 8 bytes of the 64-bit call gate */
                if (load_segment_ra(env, &e1, &e2, new_cs + 8, GETPC())) {
                    raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc,
                                           GETPC());
                }
                type = (e2 >> DESC_TYPE_SHIFT) & 0x1f;
                if (type != 0) {
                    raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc,
                                           GETPC());
                }
                new_eip |= ((target_ulong)e1) << 32;
            }
#endif

            if (load_segment_ra(env, &e1, &e2, gate_cs, GETPC()) != 0) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
            dpl = (e2 >> DESC_DPL_SHIFT) & 3;
            /* must be code segment */
            if (((e2 & (DESC_S_MASK | DESC_CS_MASK)) !=
                 (DESC_S_MASK | DESC_CS_MASK))) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
            if (((e2 & DESC_C_MASK) && (dpl > cpl)) ||
                (!(e2 & DESC_C_MASK) && (dpl != cpl))) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
#ifdef TARGET_X86_64
            if (env->efer & MSR_EFER_LMA) {
                if (!(e2 & DESC_L_MASK)) {
                    raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
                }
                if (e2 & DESC_B_MASK) {
                    raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
                }
            }
#endif
            if (!(e2 & DESC_P_MASK)) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
            limit = get_seg_limit(e1, e2);
            if (new_eip > limit &&
                (!(env->hflags & HF_LMA_MASK) || !(e2 & DESC_L_MASK))) {
                raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
            }
            cpu_x86_load_seg_cache(env, R_CS, (gate_cs & 0xfffc) | cpl,
                                   get_seg_base(e1, e2), limit, e2);
            env->eip = new_eip;
            break;
        default:
            raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            break;
        }
    }
}